

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

CompoundStmt * __thiscall Parser::compound_statement(Parser *this)

{
  uint uVar1;
  pointer *pppSVar2;
  int iVar3;
  TokenKind TVar4;
  iterator __position;
  CompoundStmt *pCVar5;
  ulong uVar6;
  pointer pTVar7;
  CompoundStmt *pCVar8;
  ulong uVar9;
  CompoundStmt *pCVar10;
  Stmt *s;
  Stmt *local_30;
  
  pCVar5 = (CompoundStmt *)operator_new(0x28);
  (pCVar5->super_Stmt).super_Node.kind = CompoundStmt;
  (pCVar5->super_Stmt).super_Node._vptr_Node = (_func_int **)&PTR__CompoundStmt_00117c70;
  (pCVar5->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pCVar5->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pCVar5->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->tok->kind != Punctuator) || (this->tok->i != 0x7b)) {
    error<char_const(&)[31]>(this,(char (*) [31])"expecting \'{\' to start a block");
  }
  iVar3 = this->tok_i;
  uVar1 = iVar3 + 1;
  this->tok_i = uVar1;
  if (-2 < iVar3) {
    uVar6 = (ulong)uVar1;
    pTVar7 = (this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar9 = ((long)(this->lex_data->tokens).super__Vector_base<Token,_std::allocator<Token>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)pTVar7 >> 2) *
            -0x3333333333333333;
    if (uVar6 <= uVar9 && uVar9 - uVar6 != 0) {
      pTVar7 = pTVar7 + uVar6;
      goto LAB_0010ec7b;
    }
  }
  pTVar7 = &this->eof;
LAB_0010ec7b:
  this->tok = pTVar7;
  pCVar10 = (CompoundStmt *)0x0;
  do {
    TVar4 = this->tok->kind;
    if (TVar4 == Punctuator) {
      pCVar8 = pCVar5;
      if (this->tok->i == 0x7d) goto LAB_0010ecea;
    }
    else if (TVar4 == Eof) {
      error<char_const(&)[25]>(this,(char (*) [25])"expecting \'}\' before EOF");
LAB_0010ece5:
      pCVar8 = (CompoundStmt *)0x0;
      pCVar10 = pCVar5;
LAB_0010ecea:
      if (pCVar10 != (CompoundStmt *)0x0) {
        (*(pCVar10->super_Stmt).super_Node._vptr_Node[1])(pCVar10);
      }
      return pCVar8;
    }
    local_30 = statement(this);
    if (local_30 == (Stmt *)0x0) goto LAB_0010ece5;
    __position._M_current =
         (pCVar5->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pCVar5->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Stmt*,std::allocator<Stmt*>>::_M_realloc_insert<Stmt*const&>
                ((vector<Stmt*,std::allocator<Stmt*>> *)&pCVar5->stmts,__position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      pppSVar2 = &(pCVar5->stmts).super__Vector_base<Stmt_*,_std::allocator<Stmt_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppSVar2 = *pppSVar2 + 1;
    }
  } while( true );
}

Assistant:

CompoundStmt* Parser::compound_statement()
{
  auto b = std::make_unique<CompoundStmt>();

  if (!is_punctuator('{'))
    error("expecting '{' to start a block");

  next_token();                 // Skip '{'

  while (tok->kind != TokenKind::Eof) {
    if (is_punctuator('}')) {
      return b.release();
    }
    else {
      auto s = statement();
      if (s)
        b->stmts.push_back(s);
      else
        return nullptr;
    }
  }

  error("expecting '}' before EOF");
  return nullptr;
}